

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfoDebug.cpp
# Opt level: O2

HighsDebugStatus debugNoInfo(HighsInfo *info)

{
  _func_int *p_Var1;
  HighsInfoType HVar2;
  pointer ppIVar3;
  HighsDebugStatus HVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  ulong uVar8;
  bool bVar9;
  HighsInfo no_info;
  
  HighsInfo::HighsInfo(&no_info);
  HighsInfo::invalidate(&no_info);
  ppIVar3 = (info->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = (ulong)((long)(info->records).
                        super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppIVar3) >> 3;
  uVar8 = 0;
  uVar6 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar6 = uVar8;
  }
  bVar7 = false;
  do {
    if (uVar6 == uVar8) {
      HVar4 = kOk;
      if (bVar7) {
        HVar4 = kLogicalError;
      }
      if ((info->super_HighsInfoStruct).valid != no_info.super_HighsInfoStruct.valid) {
        HVar4 = kLogicalError;
      }
      HighsInfo::~HighsInfo(&no_info);
      return HVar4;
    }
    HVar2 = ppIVar3[uVar8]->type;
    if (HVar2 == kDouble) {
      p_Var1 = *ppIVar3[uVar8][1]._vptr_InfoRecord;
      if (NAN((double)p_Var1)) {
        printf("debugNoInfo: Index %d has %g != %g \n",p_Var1,p_Var1,uVar8 & 0xffffffff);
        ppIVar3 = (info->records).super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      bVar7 = (bool)(bVar7 | (double)*ppIVar3[uVar8][1]._vptr_InfoRecord !=
                             (double)*no_info.records.
                                      super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar8][1].
                                      _vptr_InfoRecord);
    }
    else {
      if (HVar2 == kInt) {
        bVar9 = *(int *)ppIVar3[uVar8][1]._vptr_InfoRecord ==
                *(int *)no_info.records.
                        super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8][1]._vptr_InfoRecord;
      }
      else {
        if (HVar2 != kInt64) goto LAB_0024d6dc;
        bVar9 = *ppIVar3[uVar8][1]._vptr_InfoRecord ==
                *no_info.records.super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar8][1]._vptr_InfoRecord;
      }
      bVar7 = (bool)(bVar7 | !bVar9);
    }
LAB_0024d6dc:
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

HighsDebugStatus debugNoInfo(const HighsInfo& info) {
  HighsInfo no_info;
  no_info.invalidate();
  bool error_found = false;
  const std::vector<InfoRecord*>& info_records = info.records;
  const std::vector<InfoRecord*>& no_info_records = no_info.records;
  HighsInt num_info = info_records.size();
  for (HighsInt index = 0; index < num_info; index++) {
    HighsInfoType type = info_records[index]->type;
    if (type == HighsInfoType::kInt64) {
      int v0 = (int)*(((InfoRecordInt64*)info_records[index])[0].value);
      int v1 = (int)*(((InfoRecordInt64*)info_records[index])[0].value);
      if (v0 != v1)
        printf("debugNoInfo: Index %" HIGHSINT_FORMAT " has %d != %d \n", index,
               v0, v1);
      error_found = (*(((InfoRecordInt64*)info_records[index])[0].value) !=
                     *(((InfoRecordInt64*)no_info_records[index])[0].value)) ||
                    error_found;
    } else if (type == HighsInfoType::kInt) {
      int v0 = (int)*(((InfoRecordInt*)info_records[index])[0].value);
      int v1 = (int)*(((InfoRecordInt*)info_records[index])[0].value);
      if (v0 != v1)
        printf("debugNoInfo: Index %" HIGHSINT_FORMAT " has %d != %d \n", index,
               v0, v1);
      error_found = (*(((InfoRecordInt*)info_records[index])[0].value) !=
                     *(((InfoRecordInt*)no_info_records[index])[0].value)) ||
                    error_found;
    } else if (type == HighsInfoType::kDouble) {
      double v0 = (double)*(((InfoRecordDouble*)info_records[index])[0].value);
      double v1 = (double)*(((InfoRecordDouble*)info_records[index])[0].value);
      if (v0 != v1)
        printf("debugNoInfo: Index %" HIGHSINT_FORMAT " has %g != %g \n", index,
               v0, v1);
      error_found = (*(((InfoRecordDouble*)info_records[index])[0].value) !=
                     *(((InfoRecordDouble*)no_info_records[index])[0].value)) ||
                    error_found;
    } else {
      assert(1 == 0);
    }
  }
  error_found = (info.valid != no_info.valid) || error_found;
  if (error_found) return HighsDebugStatus::kLogicalError;
  return HighsDebugStatus::kOk;
}